

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void save_waterlevel(memfile *mf)

{
  boolean bVar1;
  bubble *pbVar2;
  uchar **ppuVar3;
  long lVar4;
  int32_t value;
  
  bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar1 != '\0') {
    value = 0;
    mtag(mf,0,MTAG_WATERLEVEL);
    if (bbubbles != (bubble *)0x0) {
      value = 0;
      pbVar2 = bbubbles;
      do {
        value = value + 1;
        pbVar2 = pbVar2->next;
      } while (pbVar2 != (bubble *)0x0);
    }
    mwrite32(mf,value);
    mwrite32(mf,xmin);
    mwrite32(mf,ymin);
    mwrite32(mf,xmax);
    mwrite32(mf,ymax);
    mwrite8(mf,bubble_up);
    for (pbVar2 = bbubbles; pbVar2 != (bubble *)0x0; pbVar2 = pbVar2->next) {
      mwrite8(mf,pbVar2->x);
      mwrite8(mf,pbVar2->y);
      mwrite8(mf,pbVar2->dx);
      mwrite8(mf,pbVar2->dy);
      ppuVar3 = bmask;
      lVar4 = 0;
      do {
        if (pbVar2->bm == *ppuVar3) {
          mwrite8(mf,(int8_t)lVar4);
        }
        lVar4 = lVar4 + 1;
        ppuVar3 = ppuVar3 + 1;
      } while (lVar4 != 7);
    }
  }
  return;
}

Assistant:

void save_waterlevel(struct memfile *mf)
{
	struct bubble *b;
	int i, n;

	if (!Is_waterlevel(&u.uz)) return;

	/*
	 * We're assuming that the number of bubbles stays constant,
	 * as we can't reasonably tag it anyway.  If they don't, we
	 * just end up with a diff that's longer than it needs to be.
	 */
	mtag(mf, 0, MTAG_WATERLEVEL);
	n = 0;
	for (b = bbubbles; b; b = b->next)
	    ++n;
	mwrite32(mf, n);
	mwrite32(mf, xmin);
	mwrite32(mf, ymin);
	mwrite32(mf, xmax);
	mwrite32(mf, ymax);
	mwrite8(mf, bubble_up);
	for (b = bbubbles; b; b = b->next) {
	    mwrite8(mf, b->x);
	    mwrite8(mf, b->y);
	    mwrite8(mf, b->dx);
	    mwrite8(mf, b->dy);
	    for (i = 0; i < SIZE(bmask); i++)
		if (b->bm == bmask[i])
		    mwrite8(mf, i);
	}
}